

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlRelaxNGFreeValidCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlRelaxNGValidCtxtPyCtxtPtr local_40;
  undefined *local_38;
  PyObject *pyobj_ctxt;
  xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
  xmlRelaxNGValidCtxtPtr ctxt;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlRelaxNGValidCtxtPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlRelaxNGFreeValidCtxt",&local_38);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_38 == &_Py_NoneStruct) {
      local_40 = (xmlRelaxNGValidCtxtPyCtxtPtr)0x0;
    }
    else {
      local_40 = *(xmlRelaxNGValidCtxtPyCtxtPtr *)(local_38 + 0x10);
    }
    pyCtxt = local_40;
    iVar1 = xmlRelaxNGGetValidErrors(local_40,0,0,&pyobj_ctxt);
    if ((iVar1 == 0) && (pyobj_ctxt != (PyObject *)0x0)) {
      _Py_XDECREF((PyObject *)pyobj_ctxt->ob_type);
      _Py_XDECREF((PyObject *)pyobj_ctxt->ob_refcnt);
      _Py_XDECREF((PyObject *)pyobj_ctxt[1].ob_refcnt);
      (*_xmlFree)(pyobj_ctxt);
    }
    xmlRelaxNGFreeValidCtxt(pyCtxt);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlRelaxNGFreeValidCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlRelaxNGValidCtxtPtr ctxt;
    xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlRelaxNGFreeValidCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlRelaxNGValidCtxtPtr) PyrelaxNgValidCtxt_Get(pyobj_ctxt);

    if (xmlRelaxNGGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == 0)
    {
        if (pyCtxt != NULL)
        {
            Py_XDECREF(pyCtxt->error);
            Py_XDECREF(pyCtxt->warn);
            Py_XDECREF(pyCtxt->arg);
            xmlFree(pyCtxt);
        }
    }
    
    xmlRelaxNGFreeValidCtxt(ctxt);
    Py_INCREF(Py_None);
    return(Py_None);
}